

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomCamera::Projection>_>::
TypedAttributeWithFallback
          (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomCamera::Projection>_> *this
          ,Animatable<tinyusdz::GeomCamera::Projection> *fallback)

{
  Animatable<tinyusdz::GeomCamera::Projection> *fallback_local;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomCamera::Projection>_> *this_local;
  
  AttrMetas::AttrMetas(&this->_metas);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector(&this->_paths);
  nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::GeomCamera::Projection>_>::optional
            (&this->_attrib);
  this->_empty = false;
  Animatable<tinyusdz::GeomCamera::Projection>::Animatable(&this->_fallback,fallback);
  this->_blocked = false;
  return;
}

Assistant:

TypedAttributeWithFallback(const T &fallback) : _fallback(fallback) {}